

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O3

void __thiscall wasm::Precompute::visitExpression(Precompute *this,Expression *curr)

{
  Id IVar1;
  Id IVar2;
  byte bVar3;
  uintptr_t uVar4;
  Module *module;
  Flow *pFVar5;
  bool bVar6;
  uint uVar7;
  Expression *pEVar8;
  Break *expression;
  Expression *expression_00;
  uintptr_t uVar9;
  byte *pbVar10;
  Nop *output;
  Name name;
  Flow local_108;
  Flow local_c0;
  Builder local_78;
  Builder builder;
  Flow flow;
  
  IVar1 = curr->_id;
  uVar7 = (uint)IVar1;
  pEVar8 = curr;
  if (uVar7 == 0x51) {
    do {
      if (1 < *(int *)(pEVar8 + 1) - 1U) goto LAB_00a124cc;
      pEVar8 = (Expression *)pEVar8[1].type.id;
      IVar2 = pEVar8->_id;
      uVar7 = (uint)IVar2;
    } while (IVar2 == RefAsId);
  }
  if ((uVar7 - 0x29 < 0x2b) && ((0x40000000005U >> ((ulong)(uVar7 - 0x29) & 0x3f) & 1) != 0)) {
    return;
  }
  if (uVar7 == 0xe) {
    return;
  }
LAB_00a124cc:
  if (IVar1 == NopId) {
    return;
  }
  if (IVar1 == TupleMakeId) {
    uVar4 = curr[1].type.id;
    if (uVar4 == 0) {
      return;
    }
    uVar9 = 0;
    while( true ) {
      for (pbVar10 = *(byte **)(*(long *)(curr + 1) + uVar9 * 8); bVar3 = *pbVar10, bVar3 == 0x51;
          pbVar10 = *(byte **)(pbVar10 + 0x18)) {
        if (1 < *(int *)(pbVar10 + 0x10) - 1U) goto LAB_00a1253d;
      }
      if (((0x2a < bVar3 - 0x29) || ((0x40000000005U >> ((ulong)(bVar3 - 0x29) & 0x3f) & 1) == 0))
         && (bVar3 != 0xe)) break;
      uVar9 = uVar9 + 1;
      if (uVar9 == uVar4) {
        return;
      }
    }
  }
LAB_00a1253d:
  precomputeExpression((Flow *)&builder,this,curr,true);
  bVar6 = canEmitConstantFor(this,(Literals *)&builder);
  if (bVar6) {
    if (flow.breakTo.super_IString.str._M_len == 0) {
      if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3)
          * -0x5555555555555555 + (long)builder.wasm == 0) {
        curr->_id = NopId;
        (curr->type).id = 0;
      }
      else {
        pEVar8 = Flow::getConstExpression
                           ((Flow *)&builder,
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                            ).
                            super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                            .
                            super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                            .currModule);
        Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
        replaceCurrent(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                        ).
                        super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                        .
                        super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                       ,pEVar8);
      }
    }
    else if (flow.breakTo.super_IString.str._M_len == DAT_010b2358) {
      considerPartiallyPrecomputing(this,curr);
    }
    else {
      if (flow.breakTo.super_IString.str._M_len == DAT_010b2338) {
        if (curr->_id != ReturnId) {
          module = (this->
                   super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                   ).
                   super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                   .
                   super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                   .currModule;
          if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
              3) * -0x5555555555555555 + (long)builder.wasm == 0) {
            pEVar8 = (Expression *)0x0;
          }
          else {
            pEVar8 = Flow::getConstExpression((Flow *)&builder,module);
          }
          expression_00 = (Expression *)MixedArena::allocSpace(&module->allocator,0x18,8);
          expression_00->_id = ReturnId;
          (expression_00->type).id = 1;
          *(Expression **)(expression_00 + 1) = pEVar8;
          Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
          replaceCurrent(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                          ).
                          super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                          .
                          super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                         ,expression_00);
          goto LAB_00a1277f;
        }
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&local_108,
                   (SmallVector<wasm::Literal,_1UL> *)&builder);
        local_108.breakTo.super_IString.str._M_len =
             (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_108.breakTo.super_IString.str._M_str = (char *)flow.breakTo.super_IString.str._M_len;
        reuseConstantNode<wasm::Return>(this,(Return *)curr,&local_108);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&local_108.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
        pFVar5 = &local_108;
      }
      else {
        if (curr->_id != BreakId) {
          local_78.wasm =
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
               ).
               super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
               .
               super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
               .currModule;
          if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                     flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
              3) * -0x5555555555555555 + (long)builder.wasm == 0) {
            pEVar8 = (Expression *)0x0;
          }
          else {
            pEVar8 = Flow::getConstExpression((Flow *)&builder,local_78.wasm);
          }
          name.super_IString.str._M_str = (char *)flow.breakTo.super_IString.str._M_len;
          name.super_IString.str._M_len =
               (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          expression = Builder::makeBreak(&local_78,name,pEVar8,(Expression *)0x0);
          Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
          replaceCurrent(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                          ).
                          super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                          .
                          super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                         ,(Expression *)expression);
          goto LAB_00a1277f;
        }
        *(pointer *)(curr + 1) =
             flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        curr[1].type.id = flow.breakTo.super_IString.str._M_len;
        curr[2].type.id = 0;
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&local_c0,
                   (SmallVector<wasm::Literal,_1UL> *)&builder);
        local_c0.breakTo.super_IString.str._M_len =
             (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_c0.breakTo.super_IString.str._M_str = (char *)flow.breakTo.super_IString.str._M_len;
        reuseConstantNode<wasm::Break>(this,(Break *)curr,&local_c0);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&local_c0.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
        pFVar5 = &local_c0;
      }
      Literal::~Literal((pFVar5->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    }
  }
LAB_00a1277f:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // TODO: if local.get, only replace with a constant if we don't care about
    // size...?
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }
    // try to evaluate this into a const
    Flow flow = precomputeExpression(curr);
    if (!canEmitConstantFor(flow.values)) {
      return;
    }
    if (flow.breaking()) {
      if (flow.breakTo == NONCONSTANT_FLOW) {
        // This cannot be turned into a constant, but perhaps we can partially
        // precompute it.
        considerPartiallyPrecomputing(curr);
        return;
      }
      if (flow.breakTo == RETURN_FLOW) {
        // this expression causes a return. if it's already a return, reuse the
        // node
        if (auto* ret = curr->dynCast<Return>()) {
          reuseConstantNode(ret, flow);
        } else {
          Builder builder(*getModule());
          replaceCurrent(builder.makeReturn(
            flow.values.isConcrete() ? flow.getConstExpression(*getModule())
                                     : nullptr));
        }
        return;
      }
      // this expression causes a break, emit it directly. if it's already a br,
      // reuse the node.
      if (auto* br = curr->dynCast<Break>()) {
        br->name = flow.breakTo;
        br->condition = nullptr;
        reuseConstantNode(br, flow);
      } else {
        Builder builder(*getModule());
        replaceCurrent(builder.makeBreak(
          flow.breakTo,
          flow.values.isConcrete() ? flow.getConstExpression(*getModule())
                                   : nullptr));
      }
      return;
    }
    // this was precomputed
    if (flow.values.isConcrete()) {
      replaceCurrent(flow.getConstExpression(*getModule()));
    } else {
      ExpressionManipulator::nop(curr);
    }
  }